

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_model<char_const*>(IsoForest *model,char **in)

{
  char cVar1;
  ushort uVar2;
  ushort *puVar3;
  size_t sVar4;
  size_type sVar5;
  pointer pvVar6;
  pointer pIVar7;
  double dVar8;
  double dVar9;
  ushort uVar10;
  ushort uVar11;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  pointer this;
  IsoTree *node;
  pointer node_00;
  ulong uVar12;
  
  if (!interrupt_switch) {
    puVar3 = (ushort *)*in;
    uVar10 = puVar3[1];
    uVar11 = puVar3[2];
    uVar2 = *puVar3;
    cVar1 = *(char *)((long)puVar3 + 3);
    *in = (char *)((long)puVar3 + 5);
    uVar12 = (ulong)CONCAT14((char)(uVar2 >> 8),(uint)(uVar2 & 0xff));
    model->new_cat_action = (int)uVar12;
    model->cat_split_type = (int)(uVar12 >> 0x20);
    model->missing_action = (uint)(byte)uVar10;
    model->has_range_penalty = cVar1 != '\0';
    model->scoring_metric = (uint)(byte)uVar11;
    dVar8 = *(double *)((long)puVar3 + 5);
    dVar9 = *(double *)((long)puVar3 + 0xd);
    *in = (char *)((long)puVar3 + 0x15);
    model->exp_avg_depth = dVar8;
    model->exp_avg_sep = dVar9;
    sVar4 = *(size_t *)((long)puVar3 + 0x15);
    sVar5 = *(size_type *)((long)puVar3 + 0x1d);
    *in = (char *)((long)puVar3 + 0x25);
    model->orig_sample_size = sVar4;
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::resize(&model->trees,sVar5);
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::_M_shrink_to_fit(&model->trees);
    pvVar6 = (model->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (model->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != pvVar6; this = this + 1) {
      sVar5 = *(size_type *)*in;
      *in = (char *)((long)*in + 8);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::resize(this,sVar5);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::_M_shrink_to_fit(this);
      pIVar7 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (node_00 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar7; node_00 = node_00 + 1) {
        deserialize_node<char_const*>(node_00,in);
      }
    }
  }
  return;
}

Assistant:

void deserialize_model(IsoForest &model, itype &in)
{
    if (interrupt_switch) return;

    uint8_t data_en[5];
    read_bytes<uint8_t>((void*)data_en, (size_t)5, in);
    model.new_cat_action = (NewCategAction)data_en[0];
    model.cat_split_type = (CategSplit)data_en[1];
    model.missing_action = (MissingAction)data_en[2];
    model.has_range_penalty = (bool)data_en[3];
    model.scoring_metric = (ScoringMetric)data_en[4];

    double data_doubles[2];
    read_bytes<double>((void*)data_doubles, (size_t)2, in);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t>((void*)data_sizets, (size_t)2, in);
    model.orig_sample_size = data_sizets[0];
    model.trees.resize(data_sizets[1]);
    model.trees.shrink_to_fit();

    size_t veclen;
    for (auto &tree : model.trees) {
        read_bytes<size_t>((void*)&veclen, (size_t)1, in);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node(node, in);
    }
}